

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayImageTextureSize.cpp
# Opt level: O2

void __thiscall
glcts::TextureCubeMapArrayTextureSizeRTFragmentShader::runShaders
          (TextureCubeMapArrayTextureSizeRTFragmentShader *this)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  GLenum drawBuffers [2];
  GLint viewport_size [4];
  long lVar3;
  
  iVar1 = (*((this->super_TextureCubeMapArrayTextureSizeRTBase).
             super_TextureCubeMapArrayTextureSizeBase.super_TestCaseBase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar3 + 0x78))
            (0x8ca9,*(undefined4 *)&(this->super_TextureCubeMapArrayTextureSizeRTBase).field_0x2cc);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"Error binding framebuffer object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageTextureSize.cpp"
                  ,0x587);
  (**(code **)(lVar3 + 0x6a0))
            (0x8ca9,0x8ce0,0xde1,(this->super_TextureCubeMapArrayTextureSizeRTBase).m_rt_std_id,0);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"Error attaching texture to GL_COLOR_ATTACHMENT0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageTextureSize.cpp"
                  ,0x58a);
  (**(code **)(lVar3 + 0x6a0))
            (0x8ca9,0x8ce1,0xde1,(this->super_TextureCubeMapArrayTextureSizeRTBase).m_rt_shw_id,0);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"Error attaching texture to GL_COLOR_ATTACHMENT0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageTextureSize.cpp"
                  ,0x58c);
  TextureCubeMapArrayTextureSizeRTBase::checkFramebufferStatus
            (&this->super_TextureCubeMapArrayTextureSizeRTBase,0x8ca9);
  (**(code **)(lVar3 + 0x560))(2);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"Error setting draw buffers",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageTextureSize.cpp"
                  ,0x594);
  (**(code **)(lVar3 + 0x868))(0xba2,viewport_size);
  (**(code **)(lVar3 + 0x1a00))(0,0,1,1);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"Setting viewport",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageTextureSize.cpp"
                  ,0x59a);
  (**(code **)(lVar3 + 0x538))(0,0,1);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"Rendering failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageTextureSize.cpp"
                  ,0x59d);
  (**(code **)(lVar3 + 0x1a00))(viewport_size[0],viewport_size[1],viewport_size[2],viewport_size[3])
  ;
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"Setting viewport",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageTextureSize.cpp"
                  ,0x5a0);
  return;
}

Assistant:

void TextureCubeMapArrayTextureSizeRTFragmentShader::runShaders(void)
{
	/* Get GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Configure draw framebuffer */
	gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, m_draw_fbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding framebuffer object");

	gl.framebufferTexture2D(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, m_rt_std_id, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error attaching texture to GL_COLOR_ATTACHMENT0");
	gl.framebufferTexture2D(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT1, GL_TEXTURE_2D, m_rt_shw_id, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error attaching texture to GL_COLOR_ATTACHMENT0");

	/* Check framebuffer status */
	checkFramebufferStatus(GL_DRAW_FRAMEBUFFER);

	/* Configure draw buffers for fragment shader */
	const glw::GLenum drawBuffers[] = { GL_COLOR_ATTACHMENT0, GL_COLOR_ATTACHMENT1 };
	gl.drawBuffers(2, drawBuffers);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting draw buffers");

	glw::GLint viewport_size[4];
	gl.getIntegerv(GL_VIEWPORT, viewport_size);

	gl.viewport(0, 0, 1, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Setting viewport");

	gl.drawArrays(GL_POINTS, 0, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Rendering failed!");

	gl.viewport(viewport_size[0], viewport_size[1], viewport_size[2], viewport_size[3]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Setting viewport");
}